

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmosSyncChannel_Generator.cpp
# Opt level: O0

void __thiscall
ASDCP::PCM::AtmosSyncChannelGenerator::AtmosSyncChannelGenerator
          (AtmosSyncChannelGenerator *this,ui16_t bitsPerSample,ui32_t sampleRate,Rational *editRate
          ,byte_t *uuid)

{
  undefined1 auVar1 [16];
  INT IVar2;
  ulong uVar3;
  float *pfVar4;
  Rational RStack_30;
  ui32_t frameRate;
  byte_t *local_28;
  byte_t *uuid_local;
  Rational *editRate_local;
  ui32_t sampleRate_local;
  ui16_t bitsPerSample_local;
  AtmosSyncChannelGenerator *this_local;
  
  local_28 = uuid;
  uuid_local = (byte_t *)editRate;
  editRate_local._0_4_ = sampleRate;
  editRate_local._6_2_ = bitsPerSample;
  _sampleRate_local = this;
  memset(this,0,0x58);
  memset(&this->m_audioTrackUUID,0,0x10);
  memset(&this->m_ADesc,0,0x30);
  AudioDescriptor::AudioDescriptor(&this->m_ADesc);
  this->m_syncSignalBuffer = (float *)0x0;
  this->m_numSamplesPerFrame = 0;
  this->m_currentFrameNumber = 0;
  this->m_numBytesPerFrame = 0;
  this->m_isSyncEncoderInitialized = false;
  (this->m_ADesc).EditRate = *(Rational *)uuid_local;
  (this->m_ADesc).ChannelCount = 1;
  (this->m_ADesc).QuantizationBits = (uint)editRate_local._6_2_;
  Rational::Rational(&stack0xffffffffffffffd0,(ui32_t)editRate_local,1);
  (this->m_ADesc).AudioSamplingRate = RStack_30;
  (this->m_ADesc).BlockAlign = (editRate_local._6_2_ + 7) / 8;
  (this->m_ADesc).AvgBps = (ui32_t)editRate_local * (this->m_ADesc).BlockAlign;
  *(undefined8 *)(this->m_audioTrackUUID).abyUUIDBytes = *(undefined8 *)local_28;
  *(undefined8 *)((this->m_audioTrackUUID).abyUUIDBytes + 8) = *(undefined8 *)(local_28 + 8);
  this->m_numSamplesPerFrame =
       (*(int *)(uuid_local + 4) * (ui32_t)editRate_local) / *(uint *)uuid_local;
  this->m_numBytesPerFrame = this->m_numSamplesPerFrame * (this->m_ADesc).BlockAlign;
  if (editRate_local._6_2_ == 0x18) {
    IVar2 = SyncEncoderInit(&this->m_syncEncoder,(ui32_t)editRate_local,
                            *(int *)uuid_local / *(int *)(uuid_local + 4),&this->m_audioTrackUUID);
    this->m_isSyncEncoderInitialized = IVar2 == 0;
    auVar1 = ZEXT416(this->m_numSamplesPerFrame) * ZEXT816(4);
    uVar3 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pfVar4 = (float *)operator_new__(uVar3);
    this->m_syncSignalBuffer = pfVar4;
  }
  else {
    this->m_isSyncEncoderInitialized = false;
  }
  return;
}

Assistant:

ASDCP::PCM::AtmosSyncChannelGenerator::AtmosSyncChannelGenerator(ui16_t bitsPerSample, ui32_t sampleRate,
                                                                 const ASDCP::Rational& editRate, const byte_t* uuid)
    : m_syncEncoder(),
      m_audioTrackUUID(),
      m_ADesc(),
      m_syncSignalBuffer(NULL),
      m_numSamplesPerFrame(0),
      m_currentFrameNumber(0),
      m_numBytesPerFrame(0),
      m_isSyncEncoderInitialized(false)
{

    m_ADesc.EditRate = editRate;
    m_ADesc.ChannelCount = 1;
    m_ADesc.QuantizationBits = bitsPerSample;
    m_ADesc.AudioSamplingRate = Rational(sampleRate, 1);
    m_ADesc.BlockAlign = ((bitsPerSample + 7) / 8);
    m_ADesc.AvgBps = (sampleRate * m_ADesc.BlockAlign);

    memcpy(&m_audioTrackUUID.abyUUIDBytes[0], uuid, UUIDlen);
    m_numSamplesPerFrame = (editRate.Denominator * sampleRate) / editRate.Numerator;
    m_numBytesPerFrame = m_numSamplesPerFrame * m_ADesc.BlockAlign;

    if (bitsPerSample == 24)
    {
        ui32_t frameRate = editRate.Numerator/editRate.Denominator; // intentionally allowing for imprecise cast to int
        m_isSyncEncoderInitialized = (SyncEncoderInit(&m_syncEncoder, sampleRate, frameRate, &m_audioTrackUUID) == SYNC_ENCODER_ERROR_NONE);
        m_syncSignalBuffer = new float[m_numSamplesPerFrame];
    }
    else
    {
        m_isSyncEncoderInitialized = false;
    }
}